

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fftrun(fitsfile *fptr,LONGLONG filesize,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  
  if (driverTable[fptr->Fptr->driver].truncate == (_func_int_int_LONGLONG *)0x0) {
    iVar2 = *status;
  }
  else {
    ffflsh(fptr,0,status);
    pFVar1 = fptr->Fptr;
    pFVar1->filesize = filesize;
    pFVar1->io_pos = filesize;
    pFVar1->logfilesize = filesize;
    pFVar1->bytepos = filesize;
    ffbfeof(fptr,status);
    iVar2 = (*driverTable[fptr->Fptr->driver].truncate)(fptr->Fptr->filehandle,filesize);
    *status = iVar2;
  }
  return iVar2;
}

Assistant:

int fftrun( fitsfile *fptr,    /* I - FITS file pointer           */
             LONGLONG filesize,   /* I - size to truncate the file   */
             int *status)      /* O - error status                */
/*
  low level routine to truncate a file to a new smaller size.
*/
{
  if (driverTable[(fptr->Fptr)->driver].truncate)
  {
    ffflsh(fptr, FALSE, status);  /* flush all the buffers first */
    (fptr->Fptr)->filesize = filesize;
    (fptr->Fptr)->io_pos = filesize;
    (fptr->Fptr)->logfilesize = filesize;
    (fptr->Fptr)->bytepos = filesize;
    ffbfeof(fptr, status);   /* eliminate any buffers beyond current EOF */
    return (*status = 
     (*driverTable[(fptr->Fptr)->driver].truncate)((fptr->Fptr)->filehandle,
     filesize) );
  }
  else
    return(*status);
}